

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::legacy::GraphBuilder::handleCallInstruction
          (GraphBuilder *this,Instruction *instruction,Block *lastBlock,bool *createBlock,
          bool *createCallReturn)

{
  Function *llvmFunction;
  bool bVar1;
  Function *function;
  pointer ppFVar2;
  StringRef SVar3;
  StringRef RHS;
  StringRef RHS_00;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> llvmFunctions;
  
  getCalledFunctions(&llvmFunctions,this,*(Value **)(instruction + -0x20));
  for (ppFVar2 = llvmFunctions.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      llvmFunctions.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    llvmFunction = *ppFVar2;
    if (*(Function **)(llvmFunction + 0x48) == llvmFunction + 0x48) {
      if (this->threads == true) {
        SVar3 = (StringRef)llvm::Value::getName();
        RHS.Length = 0xe;
        RHS.Data = "pthread_create";
        bVar1 = llvm::operator==(SVar3,RHS);
        if (bVar1) {
          bVar1 = createPthreadCreate(this,(CallInst *)instruction,lastBlock);
          *createBlock = (bool)(*createBlock | bVar1);
        }
        else {
          SVar3 = (StringRef)llvm::Value::getName();
          RHS_00.Length = 0xc;
          RHS_00.Data = "pthread_join";
          bVar1 = llvm::operator==(SVar3,RHS_00);
          if (bVar1) {
            bVar1 = createPthreadJoin(this,(CallInst *)instruction,lastBlock);
            *createCallReturn = (bool)(*createCallReturn | bVar1);
          }
        }
      }
    }
    else {
      function = createOrGetFunction(this,llvmFunction);
      Block::addCallee(lastBlock,llvmFunction,function);
      *createCallReturn = true;
    }
  }
  std::_Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~_Vector_base
            (&llvmFunctions.
              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>);
  return;
}

Assistant:

void GraphBuilder::handleCallInstruction(const llvm::Instruction *instruction,
                                         Block *lastBlock, bool &createBlock,
                                         bool &createCallReturn) {
    const auto *callInst = llvm::cast<llvm::CallInst>(instruction);
#if LLVM_VERSION_MAJOR >= 8
    auto *val = callInst->getCalledOperand();
#else
    auto *val = callInst->getCalledValue();
#endif
    auto llvmFunctions = getCalledFunctions(val);

    for (const auto *llvmFunction : llvmFunctions) {
        if (!llvmFunction->empty()) {
            auto *function = createOrGetFunction(llvmFunction);
            lastBlock->addCallee(llvmFunction, function);
            createCallReturn |= true;
        } else if (threads) {
            if (llvmFunction->getName() == "pthread_create") {
                createBlock |= createPthreadCreate(callInst, lastBlock);
            } else if (llvmFunction->getName() == "pthread_join") {
                createCallReturn |= createPthreadJoin(callInst, lastBlock);
            }
        }
    }
}